

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaFanout.c
# Opt level: O1

void Gia_ManFanoutStart(Gia_Man_t *p)

{
  Gia_Obj_t *pFanout;
  Gia_Obj_t *pGVar1;
  int *__s;
  ulong uVar2;
  Gia_Obj_t *pObj;
  long lVar3;
  int iVar4;
  long lVar5;
  
  if (p->pFanData != (int *)0x0) {
    __assert_fail("p->pFanData == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaFanout.c"
                  ,0x47,"void Gia_ManFanoutStart(Gia_Man_t *)");
  }
  iVar4 = 0x1000;
  if (0x7ff < p->nObjs) {
    iVar4 = p->nObjs * 2;
  }
  p->nFansAlloc = iVar4;
  __s = (int *)malloc((long)(iVar4 * 5) << 2);
  p->pFanData = __s;
  memset(__s,0,(long)iVar4 * 0x14);
  if (0 < p->nObjs) {
    lVar5 = 0;
    lVar3 = 0;
    do {
      pGVar1 = p->pObjs;
      if (pGVar1 == (Gia_Obj_t *)0x0) {
        return;
      }
      pFanout = (Gia_Obj_t *)(&pGVar1->field_0x0 + lVar5);
      pObj = (Gia_Obj_t *)
             (lVar5 + (ulong)((*(uint *)(&pGVar1->field_0x0 + lVar5) & 0x1fffffff) << 2) * -3 +
             (long)pGVar1);
      if (pObj != (Gia_Obj_t *)(ulong)((*(uint *)(&pGVar1->field_0x0 + lVar5) >> 0x1d & 1) != 0)) {
        Gia_ObjAddFanout(p,pObj,pFanout);
      }
      uVar2 = (ulong)(((uint)(*(ulong *)(&pGVar1->field_0x0 + lVar5) >> 0x20) & 0x1fffffff) << 2);
      if ((long)pGVar1 + lVar5 + uVar2 * -3 !=
          (ulong)((*(ulong *)(&pGVar1->field_0x0 + lVar5) >> 0x3d & 1) != 0)) {
        Gia_ObjAddFanout(p,(Gia_Obj_t *)((long)pFanout + uVar2 * -3),pFanout);
      }
      lVar3 = lVar3 + 1;
      lVar5 = lVar5 + 0xc;
    } while (lVar3 < p->nObjs);
  }
  return;
}

Assistant:

void Gia_ManFanoutStart( Gia_Man_t * p )
{
    Gia_Obj_t * pObj;
    int i;
    // allocate fanout datastructure
    assert( p->pFanData == NULL );
    p->nFansAlloc = 2 * Gia_ManObjNum(p);
    if ( p->nFansAlloc < (1<<12) )
        p->nFansAlloc = (1<<12);
    p->pFanData = ABC_ALLOC( int, 5 * p->nFansAlloc );
    memset( p->pFanData, 0, sizeof(int) * 5 * p->nFansAlloc );
    // add fanouts for all objects
    Gia_ManForEachObj( p, pObj, i )
    {
        if ( Gia_ObjChild0(pObj) )
            Gia_ObjAddFanout( p, Gia_ObjFanin0(pObj), pObj );
        if ( Gia_ObjChild1(pObj) )
            Gia_ObjAddFanout( p, Gia_ObjFanin1(pObj), pObj );
    }
}